

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintextedit.cpp
# Opt level: O0

QRect __thiscall QPlainTextEdit::cursorRect(QPlainTextEdit *this,QTextCursor *cursor)

{
  long lVar1;
  ulong uVar2;
  long in_FS_OFFSET;
  QRect QVar3;
  QPlainTextEditPrivate *d;
  QRect r;
  int in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  QPlainTextEditPrivate *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  QRectF *in_stack_ffffffffffffffc8;
  undefined1 local_18 [16];
  undefined1 auVar4 [12];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QPlainTextEdit *)0x6c81fa);
  uVar2 = QTextCursor::isNull();
  if ((uVar2 & 1) == 0) {
    QPlainTextEditControl::cursorRect
              ((QPlainTextEditControl *)
               CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
               (QTextCursor *)in_stack_ffffffffffffffa0);
    local_18 = (undefined1  [16])QRectF::toRect(in_stack_ffffffffffffffc8);
    QPlainTextEditPrivate::horizontalOffset(in_stack_ffffffffffffffa0);
    QPlainTextEditPrivate::verticalOffset(in_stack_ffffffffffffffa0);
    QRect::translate((QRect *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,
                     in_stack_ffffffffffffff98);
  }
  else {
    QRect::QRect((QRect *)in_stack_ffffffffffffffa0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    QVar3.x1.m_i = local_18._0_4_;
    auVar4._4_4_ = local_18._4_4_;
    QVar3.x2.m_i = local_18._8_4_;
    QVar3.y2.m_i = local_18._12_4_;
    return QVar3;
  }
  __stack_chk_fail();
}

Assistant:

QRect QPlainTextEdit::cursorRect(const QTextCursor &cursor) const
{
    Q_D(const QPlainTextEdit);
    if (cursor.isNull())
        return QRect();

    QRect r = d->control->cursorRect(cursor).toRect();
    r.translate(-d->horizontalOffset(),-(int)d->verticalOffset());
    return r;
}